

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O2

MultiFileColumnDefinition *
duckdb::MultiFileColumnDefinition::CreateFromNameAndType
          (MultiFileColumnDefinition *__return_storage_ptr__,string *name,LogicalType *type)

{
  pointer ppVar1;
  child_list_t<LogicalType> *pcVar2;
  pointer name_00;
  MultiFileColumnDefinition local_c0;
  
  MultiFileColumnDefinition(__return_storage_ptr__,name,type);
  if (type->id_ == STRUCT) {
    pcVar2 = StructType::GetChildTypes_abi_cxx11_(type);
    ppVar1 = (pcVar2->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name_00 = (pcVar2->
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; name_00 != ppVar1;
        name_00 = name_00 + 1) {
      CreateFromNameAndType(&local_c0,&name_00->first,&name_00->second);
      ::std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::emplace_back<duckdb::MultiFileColumnDefinition>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,&local_c0);
      ~MultiFileColumnDefinition(&local_c0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static MultiFileColumnDefinition CreateFromNameAndType(const string &name, const LogicalType &type) {
		MultiFileColumnDefinition result(name, type);
		if (type.id() == LogicalTypeId::STRUCT) {
			// recursively create for children
			for (auto &child_entry : StructType::GetChildTypes(type)) {
				result.children.push_back(CreateFromNameAndType(child_entry.first, child_entry.second));
			}
		}
		return result;
	}